

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathRegisterAllFunctions(xmlXPathContextPtr ctxt)

{
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"boolean",(xmlChar *)0x0,xmlXPathBooleanFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"ceiling",(xmlChar *)0x0,xmlXPathCeilingFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"count",(xmlChar *)0x0,xmlXPathCountFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"concat",(xmlChar *)0x0,xmlXPathConcatFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"contains",(xmlChar *)0x0,xmlXPathContainsFunction);
  xmlXPathRegisterFuncNS(ctxt,"id",(xmlChar *)0x0,xmlXPathIdFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"false",(xmlChar *)0x0,xmlXPathFalseFunction);
  xmlXPathRegisterFuncNS(ctxt,"floor",(xmlChar *)0x0,xmlXPathFloorFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"last",(xmlChar *)0x0,xmlXPathLastFunction);
  xmlXPathRegisterFuncNS(ctxt,"lang",(xmlChar *)0x0,xmlXPathLangFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"local-name",(xmlChar *)0x0,xmlXPathLocalNameFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"not",(xmlChar *)0x0,xmlXPathNotFunction);
  xmlXPathRegisterFuncNS(ctxt,"name",(xmlChar *)0x0,xmlXPathNameFunction);
  xmlXPathRegisterFuncNS
            (ctxt,(xmlChar *)"namespace-uri",(xmlChar *)0x0,xmlXPathNamespaceURIFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"normalize-space",(xmlChar *)0x0,xmlXPathNormalizeFunction)
  ;
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"number",(xmlChar *)0x0,xmlXPathNumberFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"position",(xmlChar *)0x0,xmlXPathPositionFunction);
  xmlXPathRegisterFuncNS(ctxt,"round",(xmlChar *)0x0,xmlXPathRoundFunction);
  xmlXPathRegisterFuncNS(ctxt,"string",(xmlChar *)0x0,xmlXPathStringFunction);
  xmlXPathRegisterFuncNS
            (ctxt,(xmlChar *)"string-length",(xmlChar *)0x0,xmlXPathStringLengthFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"starts-with",(xmlChar *)0x0,xmlXPathStartsWithFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"substring",(xmlChar *)0x0,xmlXPathSubstringFunction);
  xmlXPathRegisterFuncNS
            (ctxt,(xmlChar *)"substring-before",(xmlChar *)0x0,xmlXPathSubstringBeforeFunction);
  xmlXPathRegisterFuncNS
            (ctxt,(xmlChar *)"substring-after",(xmlChar *)0x0,xmlXPathSubstringAfterFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"sum",(xmlChar *)0x0,xmlXPathSumFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"true",(xmlChar *)0x0,xmlXPathTrueFunction);
  xmlXPathRegisterFuncNS(ctxt,(xmlChar *)"translate",(xmlChar *)0x0,xmlXPathTranslateFunction);
  xmlXPathRegisterFuncNS
            (ctxt,(xmlChar *)"escape-uri",(xmlChar *)"http://www.w3.org/2002/08/xquery-functions",
             xmlXPathEscapeUriFunction);
  return;
}

Assistant:

void
xmlXPathRegisterAllFunctions(xmlXPathContextPtr ctxt)
{
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"boolean",
                         xmlXPathBooleanFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"ceiling",
                         xmlXPathCeilingFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"count",
                         xmlXPathCountFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"concat",
                         xmlXPathConcatFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"contains",
                         xmlXPathContainsFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"id",
                         xmlXPathIdFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"false",
                         xmlXPathFalseFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"floor",
                         xmlXPathFloorFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"last",
                         xmlXPathLastFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"lang",
                         xmlXPathLangFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"local-name",
                         xmlXPathLocalNameFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"not",
                         xmlXPathNotFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"name",
                         xmlXPathNameFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"namespace-uri",
                         xmlXPathNamespaceURIFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"normalize-space",
                         xmlXPathNormalizeFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"number",
                         xmlXPathNumberFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"position",
                         xmlXPathPositionFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"round",
                         xmlXPathRoundFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"string",
                         xmlXPathStringFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"string-length",
                         xmlXPathStringLengthFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"starts-with",
                         xmlXPathStartsWithFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"substring",
                         xmlXPathSubstringFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"substring-before",
                         xmlXPathSubstringBeforeFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"substring-after",
                         xmlXPathSubstringAfterFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"sum",
                         xmlXPathSumFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"true",
                         xmlXPathTrueFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"translate",
                         xmlXPathTranslateFunction);

    xmlXPathRegisterFuncNS(ctxt, (const xmlChar *)"escape-uri",
	 (const xmlChar *)"http://www.w3.org/2002/08/xquery-functions",
                         xmlXPathEscapeUriFunction);
}